

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

Float pbrt::Checkerboard(TextureEvalContext ctx,TextureMapping2DHandle *map2D,
                        TextureMapping3DHandle *map3D)

{
  float fVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  byte bVar4;
  anon_class_24_3_48d30edf func;
  TransformMapping3D *ptr;
  _lambda_auto_1__1_ *this;
  Float FVar5;
  undefined1 auVar9 [16];
  Float FVar6;
  Point2f PVar7;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar11 [64];
  undefined1 auVar10 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Point3f PVar17;
  Float local_c8;
  Tuple2<pbrt::Vector2,_float> local_b0;
  undefined8 ***local_a8;
  Tuple3<pbrt::Point3,_float> *local_a0;
  undefined8 ***pppuStack_98;
  Tuple2<pbrt::Vector2,_float> *local_90;
  Tuple2<pbrt::Vector2,_float> *local_88;
  uint local_80;
  undefined8 ***local_78;
  uint local_70;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [4];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  ptr = (TransformMapping3D *)
        ((map3D->super_TaggedPointer<pbrt::TransformMapping3D>).bits & 0xffffffffffff);
  if (((map2D->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits & 0xffffffffffff) == 0) {
    if (ptr == (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[6]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
                 ,0xb9,"Check failed: %s",(char (*) [6])0x4357e4);
    }
    local_a8 = &local_78;
    local_b0 = (Tuple2<pbrt::Vector2,_float>)&local_88;
    local_a0 = local_58;
    pppuStack_98 = &local_a8;
    local_90 = &local_b0;
    this = (_lambda_auto_1__1_ *)&local_a0;
    local_78 = (undefined8 ***)0x0;
    local_88 = (Tuple2<pbrt::Vector2,_float> *)0x0;
    local_70 = 0;
    local_80 = 0;
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    PVar17 = const::{lambda(auto:1)#1}::operator()(this,ptr);
    local_68 = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_78;
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_88;
    auVar9 = vandps_avx(auVar10,auVar16);
    auVar10 = vandps_avx(auVar14,auVar16);
    uVar3 = vcmpps_avx512vl(auVar9,auVar10,1);
    auVar2 = vshufps_avx(auVar9,auVar9,0xf5);
    bVar4 = (byte)(uVar3 >> 1);
    auVar8 = vshufps_avx(auVar10,auVar10,0xf5);
    auVar14 = vandps_avx(ZEXT416(local_70),auVar16);
    auVar16 = vandps_avx(ZEXT416(local_80),auVar16);
    auVar14 = vmaxss_avx(auVar16,auVar14);
    _fStack_60 = ctx._8_8_;
    FVar5 = Checkerboard::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)this,PVar17.super_Tuple3<pbrt::Point3,_float>.x,
                       (float)((uint)((byte)uVar3 & 1) * auVar10._0_4_ +
                              (uint)!(bool)((byte)uVar3 & 1) * auVar9._0_4_) * 1.5);
    auVar9._8_4_ = fStack_60;
    auVar9._12_4_ = fStack_5c;
    auVar9._0_8_ = local_68;
    auVar9 = vmovshdup_avx(auVar9);
    FVar6 = Checkerboard::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)this,auVar9._0_4_,
                       (float)((uint)(bVar4 & 1) * auVar8._0_4_ +
                              (uint)!(bool)(bVar4 & 1) * auVar2._0_4_) * 1.5);
    auVar12._0_4_ =
         Checkerboard::anon_class_8_1_54a39804::operator()
                   ((anon_class_8_1_54a39804 *)this,PVar17.super_Tuple3<pbrt::Point3,_float>.z,
                    auVar14._0_4_ * 1.5);
    auVar12._4_60_ = extraout_var_00;
    auVar9 = auVar12._0_16_;
    fVar1 = FVar5 * -0.5 * FVar6;
  }
  else {
    if (ptr != (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[7]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
                 ,0xad,"Check failed: %s",(char (*) [7])"!map3D");
    }
    local_a0 = local_58;
    local_78 = &local_a8;
    local_88 = &local_b0;
    pppuStack_98 = &local_78;
    local_90 = (Tuple2<pbrt::Vector2,_float> *)&local_88;
    local_a8 = (undefined8 ***)0x0;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    func.dstdx = (Vector2f **)pppuStack_98;
    func.ctx = (TextureEvalContext *)local_a0;
    func.dstdy = (Vector2f **)local_90;
    PVar7 = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
            ::
            Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                        *)map2D,func);
    local_c8 = PVar7.super_Tuple2<pbrt::Point2,_float>.x;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_a8;
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar15._8_8_ = 0;
    auVar15._0_4_ = local_b0.x;
    auVar15._4_4_ = local_b0.y;
    auVar9 = vandps_avx(auVar8,auVar13);
    auVar10 = vandps_avx(auVar15,auVar13);
    uVar3 = vcmpps_avx512vl(auVar9,auVar10,1);
    auVar14 = vshufps_avx(auVar9,auVar9,0xf5);
    bVar4 = (byte)(uVar3 >> 1);
    auVar16 = vshufps_avx(auVar10,auVar10,0xf5);
    FVar5 = Checkerboard::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)map2D,local_c8,
                       (float)((uint)((byte)uVar3 & 1) * auVar10._0_4_ +
                              (uint)!(bool)((byte)uVar3 & 1) * auVar9._0_4_) * 1.5);
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = PVar7.super_Tuple2<pbrt::Point2,_float>.x;
    auVar2._4_4_ = PVar7.super_Tuple2<pbrt::Point2,_float>.y;
    auVar9 = vmovshdup_avx(auVar2);
    auVar11._0_4_ =
         Checkerboard::anon_class_8_1_54a39804::operator()
                   ((anon_class_8_1_54a39804 *)map2D,auVar9._0_4_,
                    (float)((uint)(bVar4 & 1) * auVar16._0_4_ +
                           (uint)!(bool)(bVar4 & 1) * auVar14._0_4_) * 1.5);
    auVar11._4_60_ = extraout_var;
    auVar9 = auVar11._0_16_;
    fVar1 = FVar5 * -0.5;
  }
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar9,ZEXT416(0x3f000000));
  return auVar9._0_4_;
}

Assistant:

Float Checkerboard(TextureEvalContext ctx, TextureMapping2DHandle map2D,
                   TextureMapping3DHandle map3D) {
    // Define 1D checkerboard filtered integral functions
    auto d = [](Float x) {
        Float y = x / 2 - std::floor(x / 2) - 0.5f;
        return x / 2 + y * (1 - 2 * std::abs(y));
    };

    auto bf = [&](Float x, Float w) -> Float {
        if (std::floor(x - w) == std::floor(x + w))
            return 1 - 2 * (int(std::floor(x)) & 1);
        return (d(x + w) - 2 * d(x) + d(x - w)) / Sqr(w);
    };

    if (map2D) {
        // Return weights for 2D checkerboard texture
        CHECK(!map3D);
        Vector2f dstdx, dstdy;
        Point2f st = map2D.Map(ctx, &dstdx, &dstdy);
        Float ds = std::max(std::abs(dstdx[0]), std::abs(dstdy[0]));
        Float dt = std::max(std::abs(dstdx[1]), std::abs(dstdy[1]));
        // Integrate product of 2D checkerboard function and triangle filter
        ds *= 1.5f;
        dt *= 1.5f;
        return 0.5f - 0.5f * bf(st[0], ds) * bf(st[1], dt);

    } else {
        // Return weights for 3D checkerboard texture
        CHECK(map3D);
        Vector3f dpdx, dpdy;
        Point3f p = map3D.Map(ctx, &dpdx, &dpdy);
        Float dx = 1.5f * std::max(std::abs(dpdx.x), std::abs(dpdy.x));
        Float dy = 1.5f * std::max(std::abs(dpdx.y), std::abs(dpdy.y));
        Float dz = 1.5f * std::max(std::abs(dpdx.z), std::abs(dpdy.z));
        return 0.5f - 0.5f * bf(p.x, dx) * bf(p.y, dy) * bf(p.z, dz);
    }
}